

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

ArgString * __thiscall Potassco::ArgString::get<bool>(ArgString *this,bool *x)

{
  bool bVar1;
  int iVar2;
  char *x_00;
  ArgString *in_RDI;
  char *next;
  char **in_stack_ffffffffffffffd8;
  
  bVar1 = ok(in_RDI);
  if (bVar1) {
    x_00 = in_RDI->in + (int)(uint)(*in_RDI->in == in_RDI->skip);
    iVar2 = Potassco::xconvert(x_00,(bool *)in_RDI,in_stack_ffffffffffffffd8,0);
    if (iVar2 == 0) {
      x_00 = (char *)0x0;
    }
    in_RDI->in = x_00;
    in_RDI->skip = ',';
  }
  return in_RDI;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}